

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval.c
# Opt level: O1

sexp sexp_load_module_file(sexp ctx,char *file,sexp env)

{
  sexp psVar1;
  sexp_sint_t n;
  sexp path;
  sexp_gc_var_t __sexp_gc_preserver1;
  sexp local_40;
  sexp_gc_var_t local_38;
  
  local_38.var = &local_40;
  local_40 = (sexp)0x43e;
  local_38.next = (ctx->value).context.saves;
  (ctx->value).context.saves = &local_38;
  local_40 = sexp_find_module_file(ctx,file);
  if ((((ulong)local_40 & 3) == 0) && (local_40->tag == 9)) {
    psVar1 = sexp_load_op(ctx,(sexp)0x0,n,local_40,env);
  }
  else {
    local_40 = sexp_c_string(ctx,file,-1);
    psVar1 = sexp_user_exception(ctx,(sexp)&DAT_0000003e,"couldn\'t find file in module path",
                                 local_40);
  }
  (ctx->value).context.saves = local_38.next;
  return psVar1;
}

Assistant:

sexp sexp_load_module_file (sexp ctx, const char *file, sexp env) {
  sexp res;
  sexp_gc_var1(path);
  sexp_gc_preserve1(ctx, path);
  path = sexp_find_module_file(ctx, file);
  if (sexp_stringp(path)) {
    res = sexp_load(ctx, path, env);
  } else {
    path = sexp_c_string(ctx, file, -1);
    res = sexp_user_exception(ctx, SEXP_FALSE, sexp_file_not_found, path);
  }
  sexp_gc_release1(ctx);
  return res;
}